

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,long>
          (result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *rslt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  detail *pdVar2;
  size_type sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  detail *local_100 [2];
  detail local_f0 [56];
  pair<long,_toml::detail::region> local_b8;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> local_68;
  
  if (*this == (detail)0x1) {
    region::comments_abi_cxx11_(&local_138,(region *)(this + 0x10));
    local_b8.first = *(long *)(this + 8);
    local_b8.second.source_name_._M_dataplus._M_p = (pointer)&local_b8.second.source_name_.field_2;
    local_b8.second.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001a7798;
    local_b8.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)(this + 0x18);
    local_b8.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this + 0x38);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)(this + 0x28) == paVar1) {
      local_b8.second.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b8.second.source_name_.field_2._8_8_ = *(undefined8 *)(this + 0x40);
    }
    else {
      local_b8.second.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b8.second.source_name_._M_dataplus._M_p =
           (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(this + 0x28);
    }
    local_b8.second.source_name_._M_string_length = *(size_type *)(this + 0x30);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(this + 0x28) = paVar1;
    *(undefined8 *)(this + 0x30) = 0;
    this[0x38] = (detail)0x0;
    local_b8.second.first_._M_current = *(char **)(this + 0x48);
    local_b8.second.last_._M_current = *(char **)(this + 0x50);
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_138.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_138.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_138.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value<long,_nullptr>
              (&local_68,&local_b8,&local_118);
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
              ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_100,
               &local_68);
    __return_storage_ptr__->is_ok_ = true;
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
              (&(__return_storage_ptr__->field_1).succ.value,
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_100);
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
              ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_100);
    basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value(&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    region::~region(&local_b8.second);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
  }
  else {
    pdVar2 = this + 0x18;
    if (*(detail **)(this + 8) == pdVar2) {
      local_f0._0_8_ = *(undefined8 *)pdVar2;
      local_f0._8_8_ = *(undefined8 *)(this + 0x20);
      local_100[0] = local_f0;
    }
    else {
      local_f0._0_8_ = *(undefined8 *)pdVar2;
      local_100[0] = *(detail **)(this + 8);
    }
    sVar3 = *(size_type *)(this + 0x10);
    *(detail **)(this + 8) = pdVar2;
    *(undefined8 *)(this + 0x10) = 0;
    this[0x18] = (detail)0x0;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_100[0] == local_f0) {
      paVar1->_M_allocated_capacity = local_f0._0_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           local_f0._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_100[0];
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_f0._0_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = sVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

result<Value, std::string>
parse_value_helper(result<std::pair<T, region>, std::string> rslt)
{
    if(rslt.is_ok())
    {
        auto comments = rslt.as_ok().second.comments();
        return ok(Value(std::move(rslt.as_ok()), std::move(comments)));
    }
    else
    {
        return err(std::move(rslt.as_err()));
    }
}